

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::labelNodeOf(BaseBuilder *this,LabelNode **out,uint32_t labelId)

{
  Error EVar1;
  LabelNode **ppLVar2;
  uint in_EDX;
  long *in_RSI;
  ZoneVector<asmjit::v1_14::LabelNode_*> *in_RDI;
  Error _err_1;
  LabelNode *node;
  Error _err;
  uint32_t index;
  ZoneAllocator *in_stack_ffffffffffffff98;
  ZoneVector<asmjit::v1_14::LabelNode_*> *in_stack_ffffffffffffffa0;
  LabelNode *i;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  LabelNode *pLVar3;
  Error local_1c;
  
  *in_RSI = 0;
  if (*(long *)(in_RDI + 0x30) == 0) {
    local_1c = DebugUtils::errored(5);
  }
  else if (in_EDX < *(uint *)(*(long *)(in_RDI + 0x30) + 0x100)) {
    if ((in_EDX < *(uint *)(in_RDI + 400)) ||
       (local_1c = ZoneVector<asmjit::v1_14::LabelNode_*>::resize
                             (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0), local_1c == 0)
       ) {
      ppLVar2 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[]
                          (in_RDI,(size_t)in_stack_ffffffffffffffa0);
      i = *ppLVar2;
      pLVar3 = i;
      if (i == (LabelNode *)0x0) {
        EVar1 = _newNodeT<asmjit::v1_14::LabelNode,unsigned_int&>
                          ((BaseBuilder *)0x0,
                           (LabelNode **)
                           CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           (uint *)in_RDI);
        if (EVar1 != 0) {
          return EVar1;
        }
        pLVar3 = i;
        ppLVar2 = ZoneVector<asmjit::v1_14::LabelNode_*>::operator[](in_RDI,(size_t)i);
        *ppLVar2 = i;
      }
      *in_RSI = (long)pLVar3;
      local_1c = 0;
    }
  }
  else {
    local_1c = DebugUtils::errored(0xc);
  }
  return local_1c;
}

Assistant:

Error BaseBuilder::labelNodeOf(LabelNode** out, uint32_t labelId) {
  *out = nullptr;

  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  uint32_t index = labelId;
  if (ASMJIT_UNLIKELY(index >= _code->labelCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _labelNodes.size())
    ASMJIT_PROPAGATE(_labelNodes.resize(&_allocator, index + 1));

  LabelNode* node = _labelNodes[index];
  if (!node) {
    ASMJIT_PROPAGATE(_newNodeT<LabelNode>(&node, labelId));
    _labelNodes[index] = node;
  }

  *out = node;
  return kErrorOk;
}